

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>&>
          (Section *this,shared_ptr<mocker::nasm::Register> *args,
          shared_ptr<mocker::nasm::NumericConstant> *args_1)

{
  allocator<char> local_41;
  string local_40;
  shared_ptr<mocker::nasm::NumericConstant> *local_20;
  shared_ptr<mocker::nasm::NumericConstant> *args_local_1;
  shared_ptr<mocker::nasm::Register> *args_local;
  Section *this_local;
  
  local_20 = args_1;
  args_local_1 = (shared_ptr<mocker::nasm::NumericConstant> *)args;
  args_local = (shared_ptr<mocker::nasm::Register> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>&>
            (this,&local_40,(shared_ptr<mocker::nasm::Register> *)args_local_1,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }